

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PFloat::PFloat(PFloat *this,uint size)

{
  PBasicType::PBasicType(&this->super_PBasicType,size,size);
  (this->super_PBasicType).super_PType.super_PTypeBase.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006ed4d0;
  FString::Format(&(this->super_PBasicType).super_PType.mDescriptiveName,"Float%d",size);
  if (size == 4) {
    (this->super_PBasicType).super_PType.MemberOnly = true;
    SetSingleSymbols(this);
  }
  else {
    if (size != 8) {
      __assert_fail("size == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                    ,0x403,"PFloat::PFloat(unsigned int)");
    }
    SetDoubleSymbols(this);
  }
  SetOps(this);
  return;
}

Assistant:

PFloat::PFloat(unsigned int size)
: PBasicType(size, size)
{
	mDescriptiveName.Format("Float%d", size);
	if (size == 8)
	{
		SetDoubleSymbols();
	}
	else
	{
		assert(size == 4);
		MemberOnly = true;
		SetSingleSymbols();
	}
	SetOps();
}